

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Editor.cxx
# Opt level: O0

int Fl_Text_Editor::kf_cut(int c,Fl_Text_Editor *e)

{
  Fl_When FVar1;
  Fl_Text_Editor *e_local;
  int c_local;
  
  kf_copy(c,e);
  kill_selection(e);
  Fl_Widget::set_changed((Fl_Widget *)e);
  FVar1 = Fl_Widget::when((Fl_Widget *)e);
  if ((FVar1 & FL_WHEN_CHANGED) != FL_WHEN_NEVER) {
    Fl_Widget::do_callback((Fl_Widget *)e);
  }
  return 1;
}

Assistant:

int Fl_Text_Editor::kf_cut(int c, Fl_Text_Editor* e) {
  kf_copy(c, e);
  kill_selection(e);
  e->set_changed();
  if (e->when()&FL_WHEN_CHANGED) e->do_callback();
  return 1;
}